

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O1

document_iterator __thiscall llvm::yaml::document_iterator::operator++(document_iterator *this)

{
  default_delete<llvm::yaml::Document> *this_00;
  Stream *S;
  bool bVar1;
  Document *this_01;
  pointer __old_p;
  Document *__ptr;
  
  if (this->Doc !=
      (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0) {
    bVar1 = Document::skip((this->Doc->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
    this_00 = (default_delete<llvm::yaml::Document> *)this->Doc;
    __ptr = *(Document **)&this_00->field_0x0;
    if (bVar1) {
      S = __ptr->stream;
      this_01 = (Document *)operator_new(0xa8);
      Document::Document(this_01,S);
      __ptr = *(Document **)&this_00->field_0x0;
      *(Document **)&this_00->field_0x0 = this_01;
    }
    else {
      *(undefined8 *)&this_00->field_0x0 = 0;
    }
    if (__ptr != (Document *)0x0) {
      std::default_delete<llvm::yaml::Document>::operator()(this_00,__ptr);
    }
    return (document_iterator)this->Doc;
  }
  __assert_fail("Doc && \"incrementing iterator past the end.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                ,0x254,"document_iterator llvm::yaml::document_iterator::operator++()");
}

Assistant:

document_iterator operator++() {
    assert(Doc && "incrementing iterator past the end.");
    if (!(*Doc)->skip()) {
      Doc->reset(nullptr);
    } else {
      Stream &S = (*Doc)->stream;
      Doc->reset(new Document(S));
    }
    return *this;
  }